

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O0

int dfft_execute(cpx_t *h_in,cpx_t *h_out,int dir,dfft_plan p)

{
  int in_EDX;
  undefined8 unaff_RBX;
  int *unaff_RBP;
  MPI_Comm in_RSI;
  MPI_Comm in_RDI;
  int *unaff_R12;
  cpx_t *unaff_R13;
  cpx_t *unaff_R14;
  int *unaff_R15;
  bool bVar1;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int in_stack_00000010;
  MPI_Comm in_stack_00000018;
  int *in_stack_00000020;
  int in_stack_00000028;
  int *in_stack_00000030;
  int *in_stack_00000038;
  cpx_t *in_stack_00000040;
  cpx_t *in_stack_00000048;
  plan_t *in_stack_00000050;
  plan_t *in_stack_00000058;
  int **in_stack_00000060;
  int **in_stack_00000068;
  int **in_stack_00000070;
  int *in_stack_00000078;
  int *in_stack_00000080;
  int *in_stack_00000088;
  int *in_stack_00000090;
  MPI_Comm in_stack_00000098;
  MPI_Comm in_stack_000000a0;
  int in_stack_000000a8;
  int in_stack_000000b8;
  int in_stack_000000d0;
  cpx_t *work;
  cpx_t *scratch;
  int out_of_place;
  int *in_stack_ffffffffffffff78;
  int *embed;
  undefined8 in_stack_ffffffffffffff80;
  int size;
  int *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  int *pdim;
  MPI_Comm poVar2;
  MPI_Comm local_58;
  int local_34;
  
  size = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  pdim = (int *)&stack0x00000008;
  if (in_stack_000000d0 == 0) {
    bVar1 = in_RDI != in_RSI;
    if (bVar1) {
      local_58 = in_stack_000000a0;
      poVar2 = in_stack_00000098;
      memcpy(in_stack_00000098,in_RDI,(long)in_stack_000000b8 << 3);
      in_RDI = poVar2;
    }
    else {
      local_58 = in_stack_00000098;
    }
    if (((in_EDX == 0) && (pdim[0x30] == 0)) || ((in_EDX != 0 && (pdim[0x31] == 0)))) {
      in_stack_ffffffffffffff94 = pdim[0x33];
      redistribute_nd((int *)in_RDI,pdim,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,size,
                      in_stack_ffffffffffffff78,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,
                      unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                      in_stack_00000020,in_stack_00000028);
    }
    embed = *(int **)(pdim + 6);
    poVar2 = in_RDI;
    mpifftnd_dif(unaff_R15,(int *)unaff_R14,(int)((ulong)unaff_R13 >> 0x20),unaff_R12,
                 (int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,in_stack_00000030,in_stack_00000038,
                 in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058,
                 in_stack_00000060,in_stack_00000068,in_stack_00000070,in_stack_00000078,
                 in_stack_00000080,in_stack_00000088,in_stack_00000090,in_stack_00000098,
                 (int *)in_stack_000000a0,in_stack_000000a8);
    if (((in_EDX != 0) && (pdim[0x30] == 0)) || ((in_EDX == 0 && (pdim[0x31] == 0)))) {
      redistribute_nd((int *)poVar2,pdim,in_stack_ffffffffffffff94,(int *)local_58,
                      (int)((ulong)in_RDI >> 0x20),embed,unaff_R13,unaff_R14,unaff_R15,unaff_RBP,
                      unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                      in_stack_00000020,in_stack_00000028);
    }
    if (bVar1) {
      memcpy(in_RSI,poVar2,(long)pdim[0x2d] << 3);
    }
    local_34 = 0;
  }
  else {
    local_34 = 2;
  }
  return local_34;
}

Assistant:

int dfft_execute(cpx_t *h_in, cpx_t *h_out, int dir, dfft_plan p)
    {
    /* only works on host plans */
    if (p.device) return 2;

    int out_of_place = (h_in == h_out) ? 0 : 1;

    cpx_t *scratch, *work;

    if (out_of_place)
        {
        work = p.scratch;
        scratch = p.scratch_2;
        memcpy(work, h_in, p.size_in*sizeof(cpx_t));
        }
    else
        {
        scratch = p.scratch;
        /*! FIXME need to ensure in buf size >= scratch_size */
        work = h_in;
        }

    if ((!dir && !p.input_cyclic) || (dir && !p.output_cyclic))
        {
        /* redistribution of input */
        redistribute_nd(p.gdim, p.pdim, p.ndim, p.pidx,
            p.size_in, p.inembed, work, scratch, p.nsend,p.nrecv,
            p.offset_send,p.offset_recv, 0, p.comm, p.proc_map, p.row_m);
        }

    /* multi-dimensional FFT */
    mpifftnd_dif(p.gdim, p.pdim, p.ndim, p.pidx, dir,
        p.size_in,p.inembed,p.oembed, work, scratch,
        dir ? p.plans_short_inverse : p.plans_short_forward,
        dir ? p.plans_long_inverse : p.plans_long_forward,
        p.rho_L, p.rho_pk0, p.rho_Lk0, p.nsend,p.nrecv,
        p.offset_send,p.offset_recv, p.comm, p.proc_map, p.row_m);

    if ((dir && !p.input_cyclic) || (!dir && !p.output_cyclic))
        {
        /* redistribution of output */
        redistribute_nd(p.gdim, p.pdim, p.ndim, p.pidx,
            p.size_out,p.oembed, work, scratch, p.nsend,p.nrecv,
            p.offset_send,p.offset_recv, 1, p.comm, p.proc_map, p.row_m);
        }

    if (out_of_place)
        {
        memcpy(h_out, work, sizeof(cpx_t)*p.size_out);
        }

    return 0;
    }